

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::log<char_const(&)[43],long,long,long,long>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [43],
               long *params_1,long *params_2,long *params_3,long *params_4)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  long *params_00;
  long *params_01;
  long *params_02;
  long *params_03;
  long lVar3;
  ArrayPtr<kj::String> in_stack_ffffffffffffff58;
  undefined8 uStack_98;
  String local_90;
  String local_78;
  String local_60;
  String local_48;
  
  str<char_const(&)[43]>
            ((String *)&stack0xffffffffffffff58,(kj *)params,
             (char (*) [43])CONCAT44(in_register_00000014,severity));
  str<long&>(&local_90,(kj *)params_1,params_00);
  str<long&>(&local_78,(kj *)params_2,params_01);
  str<long&>(&local_60,(kj *)params_3,params_02);
  str<long&>(&local_48,(kj *)params_4,params_03);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              &stack0xffffffffffffff58,in_stack_ffffffffffffff58);
  lVar3 = 0x60;
  do {
    lVar1 = *(long *)(&stack0xffffffffffffff58 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(&stack0xffffffffffffff60 + lVar3);
      *(undefined8 *)(&stack0xffffffffffffff58 + lVar3) = 0;
      *(undefined8 *)(&stack0xffffffffffffff60 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&uStack_98 + lVar3))
                (*(undefined8 **)((long)&uStack_98 + lVar3),lVar1,1,uVar2,uVar2,0);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}